

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LSTMWeightParams::MergeFrom(LSTMWeightParams *this,LSTMWeightParams *from)

{
  ulong uVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x8df1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  puVar3 = (undefined1 *)from->inputgateweightmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgateweightmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->inputgateweightmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->forgetgateweightmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgateweightmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->forgetgateweightmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->blockinputweightmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputweightmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->blockinputweightmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->outputgateweightmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgateweightmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgateweightmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->outputgateweightmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->inputgaterecursionmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgaterecursionmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->inputgaterecursionmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->forgetgaterecursionmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgaterecursionmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->forgetgaterecursionmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->blockinputrecursionmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputrecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputrecursionmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->blockinputrecursionmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->outputgaterecursionmatrix_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgaterecursionmatrix_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgaterecursionmatrix_ = pWVar2;
      puVar3 = (undefined1 *)from->outputgaterecursionmatrix_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->inputgatebiasvector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgatebiasvector_ = pWVar2;
      puVar3 = (undefined1 *)from->inputgatebiasvector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->forgetgatebiasvector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgatebiasvector_ = pWVar2;
      puVar3 = (undefined1 *)from->forgetgatebiasvector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->blockinputbiasvector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->blockinputbiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->blockinputbiasvector_ = pWVar2;
      puVar3 = (undefined1 *)from->blockinputbiasvector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->outputgatebiasvector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgatebiasvector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgatebiasvector_ = pWVar2;
      puVar3 = (undefined1 *)from->outputgatebiasvector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->inputgatepeepholevector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->inputgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->inputgatepeepholevector_ = pWVar2;
      puVar3 = (undefined1 *)from->inputgatepeepholevector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->forgetgatepeepholevector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->forgetgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->forgetgatepeepholevector_ = pWVar2;
      puVar3 = (undefined1 *)from->forgetgatepeepholevector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  puVar3 = (undefined1 *)from->outputgatepeepholevector_;
  if ((WeightParams *)puVar3 != (WeightParams *)0x0 &&
      from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) {
    pWVar2 = this->outputgatepeepholevector_;
    if (pWVar2 == (WeightParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar4);
      this->outputgatepeepholevector_ = pWVar2;
      puVar3 = (undefined1 *)from->outputgatepeepholevector_;
    }
    if ((WeightParams *)puVar3 == (WeightParams *)0x0) {
      puVar3 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,(WeightParams *)puVar3);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void LSTMWeightParams::MergeFrom(const LSTMWeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LSTMWeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_inputgateweightmatrix()) {
    _internal_mutable_inputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgateweightmatrix());
  }
  if (from._internal_has_forgetgateweightmatrix()) {
    _internal_mutable_forgetgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgateweightmatrix());
  }
  if (from._internal_has_blockinputweightmatrix()) {
    _internal_mutable_blockinputweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputweightmatrix());
  }
  if (from._internal_has_outputgateweightmatrix()) {
    _internal_mutable_outputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgateweightmatrix());
  }
  if (from._internal_has_inputgaterecursionmatrix()) {
    _internal_mutable_inputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgaterecursionmatrix());
  }
  if (from._internal_has_forgetgaterecursionmatrix()) {
    _internal_mutable_forgetgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgaterecursionmatrix());
  }
  if (from._internal_has_blockinputrecursionmatrix()) {
    _internal_mutable_blockinputrecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputrecursionmatrix());
  }
  if (from._internal_has_outputgaterecursionmatrix()) {
    _internal_mutable_outputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgaterecursionmatrix());
  }
  if (from._internal_has_inputgatebiasvector()) {
    _internal_mutable_inputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatebiasvector());
  }
  if (from._internal_has_forgetgatebiasvector()) {
    _internal_mutable_forgetgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatebiasvector());
  }
  if (from._internal_has_blockinputbiasvector()) {
    _internal_mutable_blockinputbiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputbiasvector());
  }
  if (from._internal_has_outputgatebiasvector()) {
    _internal_mutable_outputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatebiasvector());
  }
  if (from._internal_has_inputgatepeepholevector()) {
    _internal_mutable_inputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatepeepholevector());
  }
  if (from._internal_has_forgetgatepeepholevector()) {
    _internal_mutable_forgetgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatepeepholevector());
  }
  if (from._internal_has_outputgatepeepholevector()) {
    _internal_mutable_outputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatepeepholevector());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}